

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tvrq_api.c
# Opt level: O0

int RqInterGetMemSizes(int nMaxK,int nMaxExtra,size_t *pInterWorkMemSize,size_t *pInterProgMemSize,
                      size_t *pInterSymNum)

{
  int iVar1;
  long *in_RCX;
  long *in_RDX;
  int in_ESI;
  long *in_R8;
  int n_cols;
  int n_rows;
  int maxISIcount;
  parameters params;
  int local_54;
  int local_50;
  int local_48;
  int local_44;
  int local_40;
  int local_4;
  
  parameters_get((int)((ulong)in_RCX >> 0x20));
  if (local_54 == -1) {
    fprintf(_stderr,"Error:%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/api/tvrq_api.c",
            0x34,"Unsupported K value.");
    local_4 = -2;
  }
  else {
    if (in_RDX != (long *)0x0) {
      *in_RDX = (long)(in_ESI + local_50) * 4 + 0x34;
    }
    iVar1 = in_ESI + local_50 + local_44 + local_40;
    if (in_RCX != (long *)0x0) {
      *in_RCX = (long)iVar1 * 4 + 0x28 + (long)(iVar1 * local_48);
    }
    if (in_R8 != (long *)0x0) {
      *in_R8 = (long)local_48;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int RqInterGetMemSizes(int nMaxK,
		       int nMaxExtra,
		       size_t* pInterWorkMemSize,
		       size_t* pInterProgMemSize,
		       size_t* pInterSymNum)
{
	/* Compute scheduler size */
	parameters params = parameters_get(nMaxK);
	if (params.K == -1) {
		errmsg("Unsupported K value.");
		return RQ_ERR_EDOM;
	}
	const int maxISIcount = nMaxExtra + params.Kprime;
	if (pInterWorkMemSize != NULL) {
		*pInterWorkMemSize = sizeof(RqInterWorkMem)
					+ maxISIcount * sizeof(uint32_t);
	}

	/* Compute the program size */
	int n_rows = maxISIcount + params.S + params.H;
	int n_cols = params.L;
	if (pInterProgMemSize != NULL) {
		*pInterProgMemSize =
		  sizeof(RqInterProgram)
		  + sizeof(int) * n_rows
		  + n_rows * n_cols;
	}

	/* Intermediate Block Size */
	if (pInterSymNum != NULL) {
		*pInterSymNum = params.L;
	}

	return 0;
}